

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_1::AggregateErrorCollector::AddError
          (AggregateErrorCollector *this,int param_2,int param_3,string *message)

{
  byte bVar1;
  string *in_RCX;
  long in_RDI;
  
  bVar1 = std::__cxx11::string::empty();
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)(in_RDI + 8),"; ");
  }
  std::__cxx11::string::operator+=((string *)(in_RDI + 8),in_RCX);
  return;
}

Assistant:

void AddError(int /* line */, int /* column */,
                const std::string& message) override {
    if (!error_.empty()) {
      error_ += "; ";
    }
    error_ += message;
  }